

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void __thiscall
duckdb::SortedAggregateBindData::SortedAggregateBindData
          (SortedAggregateBindData *this,ClientContext *context_p,Expressions *children,
          AggregateFunction *aggregate,BindInfoPtr *bind_info,OrderBys *order_bys)

{
  vector<duckdb::LogicalType,_true> *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  pointer pBVar3;
  FunctionNullHandling FVar4;
  FunctionErrors FVar5;
  FunctionCollationHandling FVar6;
  AggregateDistinctDependent AVar7;
  read_data_from_segment_t p_Var8;
  int iVar9;
  ClientConfig *pCVar10;
  pointer pEVar11;
  reference pvVar12;
  reference this_02;
  reference pvVar13;
  type pEVar14;
  long lVar15;
  pointer this_03;
  ulong __n;
  aggregate_size_t *pp_Var16;
  aggregate_size_t *pp_Var17;
  pointer this_04;
  bool bVar18;
  byte bVar19;
  ListSegmentFunctions funcs;
  ListSegmentFunctions local_68;
  
  bVar19 = 0;
  (this->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__SortedAggregateBindData_019b82f0;
  this->context = context_p;
  SimpleFunction::SimpleFunction((SimpleFunction *)&this->function,(SimpleFunction *)aggregate);
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01999660;
  LogicalType::LogicalType
            (&(this->function).super_BaseScalarFunction.return_type,
             &(aggregate->super_BaseScalarFunction).return_type);
  FVar4 = (aggregate->super_BaseScalarFunction).null_handling;
  FVar5 = (aggregate->super_BaseScalarFunction).errors;
  FVar6 = (aggregate->super_BaseScalarFunction).collation_handling;
  (this->function).super_BaseScalarFunction.stability =
       (aggregate->super_BaseScalarFunction).stability;
  (this->function).super_BaseScalarFunction.null_handling = FVar4;
  (this->function).super_BaseScalarFunction.errors = FVar5;
  (this->function).super_BaseScalarFunction.collation_handling = FVar6;
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0199c528;
  pp_Var16 = &aggregate->state_size;
  pp_Var17 = &(this->function).state_size;
  for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
    *pp_Var17 = *pp_Var16;
    pp_Var16 = pp_Var16 + (ulong)bVar19 * -2 + 1;
    pp_Var17 = pp_Var17 + (ulong)bVar19 * -2 + 1;
  }
  AVar7 = aggregate->distinct_dependent;
  (this->function).order_dependent = aggregate->order_dependent;
  (this->function).distinct_dependent = AVar7;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aggregate->function_info).internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (aggregate->function_info).internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00 = &this->arg_types;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arg_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bind_info).
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (bind_info->
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (bind_info->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  this_01 = &this->sort_types;
  (this->sort_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sort_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sort_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sort_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sort_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sort_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arg_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arg_funcs).
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar10 = ClientConfig::GetConfig(this->context);
  this->threshold = pCVar10->ordered_aggregate_threshold;
  pCVar10 = ClientConfig::GetConfig(this->context);
  this->external = pCVar10->force_external;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (long)(children->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(children->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  reserve(&(this->arg_funcs).
           super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
          ,(long)(children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  this_03 = (children->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (children->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != puVar2) {
    do {
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_03);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_00,
                 &pEVar11->return_type);
      local_68.initial_capacity = 4;
      local_68.child_functions.
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.child_functions.
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.child_functions.
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar12 = vector<duckdb::LogicalType,_true>::back(this_00);
      GetSegmentDataFunctions(&local_68,pvVar12);
      ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
      emplace_back<duckdb::ListSegmentFunctions>
                (&(this->arg_funcs).
                  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                 ,&local_68);
      ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
      ~vector(&local_68.child_functions.
               super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
             );
      this_03 = this_03 + 1;
    } while (this_03 != puVar2);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&this_01->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             ((long)(order_bys->
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ).
                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(order_bys->
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ).
                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  reserve(&(this->sort_funcs).
           super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
          ,((long)(order_bys->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
                  .
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(order_bys->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
                  .
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  this_04 = (order_bys->
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (order_bys->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_04 != pBVar3) {
    do {
      BoundOrderByNode::Copy((BoundOrderByNode *)&local_68,this_04);
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
      emplace_back<duckdb::BoundOrderByNode>
                (&(this->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
                 (BoundOrderByNode *)&local_68);
      p_Var8 = local_68.read_data;
      if ((BaseStatistics *)local_68.read_data != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_68.read_data);
        operator_delete(p_Var8);
      }
      local_68.read_data = (read_data_from_segment_t)0x0;
      if (local_68.write_data != (write_data_to_segment_t)0x0) {
        (**(code **)(*(long *)local_68.write_data + 8))();
      }
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&this_04->expression);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
                 &pEVar11->return_type);
      local_68.initial_capacity = 4;
      local_68.child_functions.
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.child_functions.
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.child_functions.
      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar12 = vector<duckdb::LogicalType,_true>::back(this_01);
      GetSegmentDataFunctions(&local_68,pvVar12);
      ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
      emplace_back<duckdb::ListSegmentFunctions>
                (&(this->sort_funcs).
                  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                 ,&local_68);
      ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
      ~vector(&local_68.child_functions.
               super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
             );
      this_04 = this_04 + 1;
    } while (this_04 != pBVar3);
  }
  bVar18 = (long)(children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(children->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 ==
           ((long)(order_bys->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
                  .
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(order_bys->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
                  .
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  this->sorted_on_args = bVar18;
  if (bVar18) {
    __n = 0;
    do {
      if ((ulong)((long)(children->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(children->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
        return;
      }
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](children,__n);
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_02);
      pvVar13 = vector<duckdb::BoundOrderByNode,_true>::operator[](order_bys,__n);
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(&pvVar13->expression);
      iVar9 = (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[10])(pEVar11,pEVar14);
      this->sorted_on_args = SUB41(iVar9,0);
      __n = __n + 1;
    } while (SUB41(iVar9,0) != false);
  }
  return;
}

Assistant:

SortedAggregateBindData(ClientContext &context_p, Expressions &children, AggregateFunction &aggregate,
	                        BindInfoPtr &bind_info, OrderBys &order_bys)
	    : context(context_p), function(aggregate), bind_info(std::move(bind_info)),
	      threshold(ClientConfig::GetConfig(context).ordered_aggregate_threshold),
	      external(ClientConfig::GetConfig(context).force_external) {
		arg_types.reserve(children.size());
		arg_funcs.reserve(children.size());
		for (const auto &child : children) {
			arg_types.emplace_back(child->return_type);
			ListSegmentFunctions funcs;
			GetSegmentDataFunctions(funcs, arg_types.back());
			arg_funcs.emplace_back(std::move(funcs));
		}
		sort_types.reserve(order_bys.size());
		sort_funcs.reserve(order_bys.size());
		for (auto &order : order_bys) {
			orders.emplace_back(order.Copy());
			sort_types.emplace_back(order.expression->return_type);
			ListSegmentFunctions funcs;
			GetSegmentDataFunctions(funcs, sort_types.back());
			sort_funcs.emplace_back(std::move(funcs));
		}
		sorted_on_args = (children.size() == order_bys.size());
		for (size_t i = 0; sorted_on_args && i < children.size(); ++i) {
			sorted_on_args = children[i]->Equals(*order_bys[i].expression);
		}
	}